

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_socket.c
# Opt level: O2

void oonf_socket_remove(oonf_socket_entry *entry)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  plVar1 = (entry->_node).next;
  if ((plVar1 != (list_entity *)0x0) && (plVar2 = (entry->_node).prev, plVar2 != (list_entity *)0x0)
     ) {
    if (((&log_global_mask)[_oonf_socket_subsystem.logging] & 1) != 0) {
      oonf_log(1,(ulong)_oonf_socket_subsystem.logging,"src/base/oonf_socket.c",0x9e,0,0,
               "Removing socket entry %s (%d)\n",entry->name,(entry->fd).fd);
      plVar1 = (entry->_node).next;
      plVar2 = (entry->_node).prev;
    }
    plVar2->next = plVar1;
    plVar1->prev = plVar2;
    (entry->_node).next = (list_entity *)0x0;
    (entry->_node).prev = (list_entity *)0x0;
    epoll_ctl(_socket_events._epoll_fd,2,(entry->fd).fd,(epoll_event *)0x0);
    return;
  }
  return;
}

Assistant:

void
oonf_socket_remove(struct oonf_socket_entry *entry) {
  if (list_is_node_added(&entry->_node)) {
    OONF_DEBUG(LOG_SOCKET, "Removing socket entry %s (%d)\n", entry->name, os_fd_get_fd(&entry->fd));

    list_remove(&entry->_node);
    os_fd_event_socket_remove(&_socket_events, &entry->fd);
  }
}